

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O0

void __thiscall SQArray::Append(SQArray *this,SQObject *o)

{
  SQObjectPtr *this_00;
  SQObject *in_RSI;
  long in_RDI;
  SQObjectPtr *this_01;
  sqvector<SQObjectPtr,_unsigned_int> *in_stack_ffffffffffffffd0;
  SQObjectPtr local_20 [2];
  
  this_00 = (SQObjectPtr *)(in_RDI + 0x30);
  this_01 = local_20;
  ::SQObjectPtr::SQObjectPtr(this_01,in_RSI);
  sqvector<SQObjectPtr,_unsigned_int>::push_back(in_stack_ffffffffffffffd0,this_01);
  ::SQObjectPtr::~SQObjectPtr(this_00);
  return;
}

Assistant:

void Append(const SQObject &o){_values.push_back(o); VT_PUSHBACK(o, _ss(this)->_root_vm); }